

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::audit_feature(audit_results *dat,float ft_weight,uint64_t ft_idx)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  ostream *poVar4;
  weight *pwVar5;
  size_type sVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this;
  ulong in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar7;
  ostringstream tempstream_1;
  string_value sv;
  ostringstream tempstream;
  string *s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string ns_pre;
  size_t stride_shift;
  uint64_t index;
  parameters *weights;
  parameters *in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  parameters *in_stack_fffffffffffffb58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffb60;
  string local_3d8 [32];
  ostream local_3b8;
  string local_240 [32];
  float local_220;
  ostream local_1f8;
  reference local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  long *local_58;
  string local_50 [32];
  ulong local_30;
  ulong local_28;
  long local_20;
  float local_c;
  long *local_8;
  
  local_20 = *in_RDI + 0x3590;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  uVar3 = parameters::mask(in_stack_fffffffffffffb48);
  local_28 = in_RSI & uVar3;
  uVar2 = parameters::stride_shift(in_stack_fffffffffffffb48);
  local_30 = (ulong)uVar2;
  std::__cxx11::string::string(local_50);
  local_58 = local_8 + 2;
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb48);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb48), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_60);
    std::__cxx11::string::operator+=(local_50,(string *)local_70);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_60);
  }
  if ((*(byte *)(*local_8 + 0x3438) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    poVar4 = std::operator<<(&local_1f8,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28 >> ((byte)local_30 & 0x3f));
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
    poVar4 = std::operator<<(poVar4,':');
    parameters::operator[]
              (in_stack_fffffffffffffb58,
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    fVar7 = trunc_weight(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
    std::ostream::operator<<(poVar4,fVar7 * (float)*(double *)(*(long *)*local_8 + 0x60));
    if ((*(byte *)(*local_8 + 0x343c) & 1) != 0) {
      poVar4 = std::operator<<(&local_1f8,'@');
      pwVar5 = parameters::operator[]
                         (in_stack_fffffffffffffb58,
                          CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      std::ostream::operator<<(poVar4,pwVar5[1]);
    }
    pwVar5 = parameters::operator[]
                       (in_stack_fffffffffffffb58,
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    local_220 = *pwVar5 * local_c;
    std::__cxx11::ostringstream::str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string(local_240);
    std::vector<GD::string_value,_std::allocator<GD::string_value>_>::push_back
              ((vector<GD::string_value,_std::allocator<GD::string_value>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    string_value::~string_value((string_value *)0x1b1937);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  }
  if (((*(long *)(*local_8 + 0x48) == 0) || ((*(byte *)(*local_8 + 0x343a) & 1) == 0)) &&
     ((*(byte *)(*local_8 + 0x3618) & 1) != 0)) {
    if (local_8[1] != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b8);
      poVar4 = std::operator<<(&local_3b8,'[');
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,(ulong)local_8[1] >> ((byte)local_30 & 0x3f));
      std::operator<<(poVar4,']');
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(local_50,local_3d8);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b8);
    }
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::count(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
    if (sVar6 == 0) {
      this = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)(*local_8 + 0x3620);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_true>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffb58,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)this,(value_type *)in_stack_fffffffffffffb58);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x1b1bb1);
    }
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void audit_feature(audit_results& dat, const float ft_weight, const uint64_t ft_idx)
{
  parameters& weights = dat.all.weights;
  uint64_t index = ft_idx & weights.mask();
  size_t stride_shift = weights.stride_shift();

  string ns_pre;
  for (string& s : dat.ns_pre) ns_pre += s;

  if (dat.all.audit)
  {
    ostringstream tempstream;
    tempstream << ':' << (index >> stride_shift) << ':' << ft_weight << ':'
               << trunc_weight(weights[index], (float)dat.all.sd->gravity) * (float)dat.all.sd->contraction;

    if (dat.all.adaptive)
      tempstream << '@' << (&weights[index])[1];

    string_value sv = {weights[index] * ft_weight, ns_pre + tempstream.str()};
    dat.results.push_back(sv);
  }

  if ((dat.all.current_pass == 0 || dat.all.training == false) && dat.all.hash_inv)
  {
    // for invert_hash

    if (dat.offset != 0)
    {
      // otherwise --oaa output no features for class > 0.
      ostringstream tempstream;
      tempstream << '[' << (dat.offset >> stride_shift) << ']';
      ns_pre += tempstream.str();
    }

    if (!dat.all.name_index_map.count(ns_pre))
      dat.all.name_index_map.insert(std::map<std::string, size_t>::value_type(ns_pre, index >> stride_shift));
  }
}